

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# znzlib.c
# Opt level: O3

size_t znzwrite(void *buf,size_t size,size_t nmemb,znzFile file)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (file == (znzFile)0x0) {
    sVar3 = 0;
  }
  else {
    if (file->zfptr == (gzFile)0x0) {
      sVar2 = fwrite(buf,size,nmemb,(FILE *)file->nzfptr);
      return sVar2;
    }
    uVar5 = nmemb * size;
    if (uVar5 == 0) {
      uVar5 = 0;
    }
    else {
      do {
        uVar4 = 0x40000000;
        if (uVar5 < 0x40000000) {
          uVar4 = uVar5;
        }
        uVar1 = gzwrite(file->zfptr,buf,uVar4 & 0xffffffff);
        if ((int)uVar1 < 0) {
          return (long)(int)uVar1;
        }
        uVar5 = uVar5 - uVar1;
      } while (((uint)uVar4 <= uVar1) && (buf = (void *)((long)buf + (ulong)uVar1), uVar5 != 0));
      if (uVar5 < size && uVar5 != 0) {
        fprintf(_stderr,"** znzwrite: write short by %u bytes\n",uVar5 & 0xffffffff);
      }
    }
    sVar3 = nmemb - uVar5 / size;
  }
  return sVar3;
}

Assistant:

size_t znzwrite(const void* buf, size_t size, size_t nmemb, znzFile file)
{
  size_t     remain = size*nmemb;
  const char * cbuf = (const char *)buf;
  unsigned   n2write;
  int        nwritten;

  if (file==NULL) { return 0; }
#ifdef HAVE_ZLIB
  if (file->zfptr!=NULL) {
    while( remain > 0 ) {
       n2write = (remain < ZNZ_MAX_BLOCK_SIZE) ? remain : ZNZ_MAX_BLOCK_SIZE;
       nwritten = gzwrite(file->zfptr, (const void *)cbuf, n2write);

       /* gzread returns 0 on error, but in case that ever changes... */
       if( nwritten < 0 ) return nwritten;

       remain -= nwritten;
       cbuf += nwritten;

       /* require writing n2write bytes, so we don't get stuck */
       if( nwritten < (int)n2write ) break;
    }

    /* warn of a short write that will seem complete */
    if( remain > 0 && remain < size )
      fprintf(stderr,"** znzwrite: write short by %u bytes\n",(unsigned)remain);

    return nmemb - remain/size;   /* return number of members processed */
  }
#endif
  return fwrite(buf,size,nmemb,file->nzfptr);
}